

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O3

void ext_defs(GlobalVars *gv,FILE *f,LinkedSection *sec,uint8_t bind,uint8_t stype,uint32_t xdeftype
             )

{
  LinkedSection *pLVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  LinkedSection *pLVar5;
  size_t sVar6;
  char *__s;
  
  pLVar1 = (LinkedSection *)(sec->n).next;
  if (pLVar1 != (LinkedSection *)0x0) {
    bVar3 = false;
    do {
      pLVar5 = pLVar1;
      if ((((uint8_t)sec->copybase == stype) && (*(uint8_t *)((long)&sec->copybase + 3) == bind)) &&
         (*(byte *)((long)&sec->copybase + 2) < 3)) {
        remnode(&sec->n);
        bVar4 = discard_symbol(gv,(Symbol *)sec);
        if (bVar4 == 0) {
          if (xdeftype == 0x100) {
            if ((stype == '\x03') && ((sec->copybase & 0x200) == 0)) {
              uVar2._0_1_ = sec->type;
              uVar2._1_1_ = sec->flags;
              uVar2._2_1_ = sec->protection;
              uVar2._3_1_ = sec->alignment;
              uVar2._4_4_ = sec->memattr;
              error(0x5d,fff_amigahunk.tname,uVar2);
            }
          }
          else {
            if (bVar3) {
              if (xdeftype != 0) goto LAB_00118a07;
LAB_00118a2c:
              __s = *(char **)&sec->type;
              sVar6 = strlen(__s);
              if (sVar6 < 0x7d) goto LAB_00118a63;
              fwrite32be(f,0x1f);
              fwritex(f,*(void **)&sec->type,0x7c);
            }
            else {
              if (xdeftype == 0) {
                if (symhunk == '\0') {
                  symhunk = '\x01';
                  fwrite32be(f,0x3f0);
                }
                goto LAB_00118a2c;
              }
              if (exthunk == '\0') {
                exthunk = '\x01';
                fwrite32be(f,0x3ef);
              }
LAB_00118a07:
              __s = *(char **)&sec->type;
LAB_00118a63:
              sVar6 = strlen(__s);
              fwrite32be(f,(int)sVar6 + 3 >> 2 | xdeftype << 0x18);
              hunk_name(f,*(char **)&sec->type);
            }
            fwrite32be(f,*(uint32_t *)&sec->destmem);
            bVar3 = true;
          }
        }
      }
      pLVar1 = (LinkedSection *)(pLVar5->n).next;
      sec = pLVar5;
    } while (pLVar1 != (LinkedSection *)0x0);
  }
  return;
}

Assistant:

static void ext_defs(struct GlobalVars *gv,FILE *f,struct LinkedSection *sec,
                     uint8_t bind,uint8_t stype,uint32_t xdeftype)
{
  struct Symbol *nextsym,*sym=(struct Symbol *)sec->symbols.first;
  bool xdefs = FALSE;

  while (nextsym = (struct Symbol *)sym->n.next) {
    if (sym->type==stype && sym->bind==bind && sym->info<=SYMI_FUNC) {
      remnode(&sym->n);

      if (!discard_symbol(gv,sym)) {
        if (xdeftype != EXT_IGNORE) {
          if (!xdefs) {
            xdefs = TRUE;
            if (xdeftype == EXT_SYMB) {
              if (!symhunk) {
                symhunk = TRUE;
                fwrite32be(f,HUNK_SYMBOL);
              }
            }
            else {
              if (!exthunk) {
                exthunk = TRUE;
                fwrite32be(f,HUNK_EXT);
              }
            }
          }
          /* generate xdef or symbol table entry */
          if (xdeftype==EXT_SYMB && strlen(sym->name)>124) {
            /* LoadSeg<=V40 doesn't allow more than 31 longwords per symbol,
               and will respond with "bad loadfile hunk" otherwise -
               so just strip the rest! */
            fwrite32be(f,(xdeftype << 24) | 31);
            fwritex(f,sym->name,124);
          }
          else {
            fwrite32be(f,(xdeftype << 24) | strlen32(sym->name));
            hunk_name(f,sym->name);           /* write symbol's name */
          }
          fwrite32be(f,(uint32_t)sym->value);  /* ... and its value */
        }

        else { /* EXT_IGNORE */
          if (stype==SYM_COMMON && !(sym->flags & SYMF_REFERENCED))
            /* Warning: unreferenced common symbol will disappear! */
            error(93,fff_amigahunk.tname,sym->name);
        }
      }
    }
    sym = nextsym;
  }
}